

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolution_x86_avx.cpp
# Opt level: O0

int __thiscall
ncnn::Deconvolution_x86_avx::forward
          (Deconvolution_x86_avx *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int *piVar1;
  long lVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [24];
  undefined1 auVar5 [32];
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 (*pauVar9) [32];
  float *pfVar10;
  Mat *in_RCX;
  void **in_RDX;
  long *in_RSI;
  long *in_RDI;
  bool bVar11;
  float fVar12;
  float fVar13;
  float w_2;
  int k;
  float val;
  int sx;
  int sxs;
  int x;
  float *sptr_3;
  int sy;
  int sys;
  int y;
  Mat m_5;
  int q;
  float *kptr;
  float sum;
  int j_3;
  int i_8;
  int outh_1;
  int outw_1;
  int channels;
  int h_1;
  int w_1;
  float *outptr;
  int p_3;
  int j_2;
  int i_7;
  float *ptr_7;
  int v_2;
  int u_2;
  float bias;
  Mat outm_2;
  float *sptr_2;
  int p_2;
  __m128 _s_1;
  __m128 _val_1;
  int j_1;
  int i_5;
  float *ptr_5;
  int v_1;
  int u_1;
  Mat outm_1;
  float *sptr_1;
  int p_1;
  __m256 _s;
  __m256 _val;
  int j;
  int i_2;
  float *ptr_2;
  int v;
  int u;
  Mat outm;
  float *sptr;
  int p;
  int gap;
  Option opt_b;
  Mat top_col2im;
  Mat bottom_blob_2;
  int maxk;
  Mat top_blob_bordered;
  int out_channels;
  size_t out_elemsize;
  int out_elempack;
  int outh;
  int outw;
  int kernel_extent_h;
  int kernel_extent_w;
  int elempack;
  size_t elemsize;
  int h;
  int w;
  Mat *m_3;
  Mat *m_2;
  Mat *m_1;
  Mat *m;
  int i_1;
  float *ptr_1;
  int size_1;
  int i;
  float *ptr;
  int size;
  int i_4;
  float *ptr_4;
  int size_3;
  int i_3;
  float *ptr_3;
  int size_2;
  int i_6;
  float *ptr_6;
  int size_4;
  Mat *m_6;
  Mat *m_4;
  float upper;
  float lower;
  float beta;
  float alpha;
  float max;
  float min;
  float slope;
  int in_stack_00001018;
  int in_stack_00001020;
  int in_stack_00001028;
  int in_stack_00001030;
  int in_stack_00001038;
  Mat *in_stack_00001040;
  Option *in_stack_00001048;
  int in_stack_00001278;
  int in_stack_00001280;
  int in_stack_00001288;
  int in_stack_00001290;
  int in_stack_00001298;
  Mat *in_stack_000012a0;
  Option *in_stack_000012a8;
  int in_stack_00001598;
  int in_stack_000015a0;
  int in_stack_000015a8;
  int in_stack_000015b0;
  int in_stack_000015b8;
  Mat *in_stack_000015c0;
  Option *in_stack_000015c8;
  int in_stack_ffffffffffffecfc;
  undefined4 in_stack_ffffffffffffed00;
  undefined4 in_stack_ffffffffffffed04;
  undefined8 in_stack_ffffffffffffed08;
  undefined8 in_stack_ffffffffffffed10;
  Mat *in_stack_ffffffffffffed18;
  Mat *in_stack_ffffffffffffed20;
  Mat *in_stack_ffffffffffffed28;
  void **ppvVar14;
  undefined7 in_stack_ffffffffffffed30;
  undefined1 in_stack_ffffffffffffed37;
  float local_12b4;
  Allocator *in_stack_ffffffffffffed78;
  undefined4 local_11b0;
  undefined8 in_stack_ffffffffffffef18;
  Mat *in_stack_ffffffffffffef20;
  Mat *in_stack_ffffffffffffef28;
  Mat *in_stack_ffffffffffffef30;
  Mat *in_stack_ffffffffffffef38;
  undefined4 in_stack_ffffffffffffef40;
  undefined4 in_stack_ffffffffffffef44;
  undefined4 in_stack_ffffffffffffef48;
  undefined4 in_stack_ffffffffffffef4c;
  undefined4 in_stack_ffffffffffffef50;
  undefined4 in_stack_ffffffffffffef54;
  undefined4 in_stack_ffffffffffffef58;
  undefined4 in_stack_ffffffffffffef5c;
  undefined8 in_stack_ffffffffffffef88;
  Mat *in_stack_ffffffffffffef90;
  Mat *in_stack_ffffffffffffef98;
  Mat *in_stack_ffffffffffffefa0;
  Mat *in_stack_ffffffffffffefa8;
  undefined8 in_stack_fffffffffffff008;
  Mat *in_stack_fffffffffffff010;
  Mat *in_stack_fffffffffffff018;
  undefined7 in_stack_fffffffffffff020;
  undefined1 in_stack_fffffffffffff027;
  Mat *in_stack_fffffffffffff028;
  undefined7 in_stack_fffffffffffff030;
  undefined1 in_stack_fffffffffffff037;
  Mat *in_stack_fffffffffffff038;
  Mat *in_stack_fffffffffffff040;
  Mat *in_stack_fffffffffffff048;
  bool local_f79;
  int local_f5c;
  int local_f3c;
  int local_f24;
  undefined8 local_f20;
  undefined8 local_f18;
  undefined8 local_f10;
  undefined4 local_f08;
  long local_f00;
  int in_stack_fffffffffffff108;
  int in_stack_fffffffffffff10c;
  Mat *in_stack_fffffffffffff110;
  Mat *in_stack_fffffffffffff118;
  Mat *in_stack_fffffffffffff120;
  undefined4 in_stack_fffffffffffff128;
  undefined4 in_stack_fffffffffffff12c;
  undefined8 local_ed0;
  undefined8 local_ec8;
  undefined8 local_ec0;
  undefined4 local_eb8;
  long local_eb0;
  undefined4 local_ea8;
  undefined4 local_ea4;
  undefined4 local_ea0;
  undefined4 local_e9c;
  undefined4 local_e98;
  undefined8 local_e90;
  long local_e88;
  float local_e80;
  int local_e7c;
  int local_e78;
  int local_e74;
  int local_e70;
  int local_e6c;
  int local_e68;
  int local_e64;
  undefined8 local_e60;
  undefined8 local_e58;
  undefined8 local_e50;
  undefined4 local_e48;
  long *local_e40;
  undefined4 local_e38;
  undefined4 local_e34;
  undefined4 local_e30;
  undefined4 local_e2c;
  undefined4 local_e28;
  undefined8 local_e20;
  void *local_e18;
  int local_e0c;
  int local_e08;
  int local_e04;
  float *local_e00;
  int local_df4;
  int local_df0;
  undefined4 local_dec;
  undefined8 local_de8;
  undefined8 local_de0;
  undefined8 local_dd8;
  undefined4 local_dd0;
  long *local_dc8;
  undefined4 local_dc0;
  undefined4 local_dbc;
  undefined4 local_db8;
  undefined4 local_db4;
  undefined4 local_db0;
  undefined8 local_da8;
  float *local_da0;
  int local_d94;
  undefined8 local_d90;
  undefined8 uStack_d88;
  undefined8 local_d80;
  undefined8 uStack_d78;
  int local_d70;
  int local_d6c;
  undefined1 (*local_d68) [16];
  int local_d60;
  int local_d5c;
  undefined8 local_d58;
  undefined8 local_d50;
  undefined8 local_d48;
  undefined4 local_d40;
  long *local_d38;
  undefined4 local_d30;
  undefined4 local_d2c;
  undefined4 local_d28;
  undefined4 local_d24;
  undefined4 local_d20;
  undefined8 local_d18;
  undefined8 *local_d10;
  int local_d04;
  undefined8 local_d00;
  undefined8 uStack_cf8;
  undefined8 uStack_cf0;
  undefined8 uStack_ce8;
  undefined8 local_ce0;
  undefined8 uStack_cd8;
  undefined8 uStack_cd0;
  undefined8 uStack_cc8;
  int local_cb0;
  int local_cac;
  int in_stack_fffffffffffff358;
  undefined1 (*pauVar15) [32];
  int in_stack_fffffffffffff360;
  int local_c9c;
  int in_stack_fffffffffffff368;
  int in_stack_fffffffffffff370;
  int in_stack_fffffffffffff378;
  Mat *in_stack_fffffffffffff380;
  undefined4 in_stack_fffffffffffff388;
  undefined4 in_stack_fffffffffffff38c;
  Option *opt_00;
  undefined4 in_stack_fffffffffffff390;
  undefined4 in_stack_fffffffffffff394;
  Mat *in_stack_fffffffffffff398;
  undefined4 uVar16;
  Mat *in_stack_fffffffffffff3a0;
  Mat *in_stack_fffffffffffff3a8;
  undefined8 *local_c50;
  int local_c48;
  void *local_c40;
  long *plStack_c38;
  size_t sStack_c30;
  undefined8 uStack_c28;
  Allocator *local_c20;
  undefined8 uStack_c18;
  undefined8 uStack_c10;
  undefined8 uStack_c08;
  void *local_bf8;
  int *local_bf0;
  long local_be8;
  undefined4 local_be0;
  long *local_bd8;
  undefined4 local_bd0;
  int local_bcc;
  undefined4 local_bc8;
  undefined4 local_bc4;
  undefined4 local_bc0;
  undefined8 local_bb8;
  void *local_bb0;
  int *local_ba8;
  long local_ba0;
  undefined4 local_b98;
  long *local_b90;
  undefined4 local_b88;
  int local_b84;
  undefined4 local_b80;
  undefined4 local_b7c;
  undefined4 local_b78;
  long local_b70;
  int local_b64;
  undefined4 local_b60;
  void *local_b50;
  int *local_b48;
  void *local_b40;
  undefined4 local_b38;
  long *local_b30;
  int local_b28;
  int local_b24;
  int local_b20;
  int local_b1c;
  int local_b18;
  void *local_b10;
  int local_b04;
  long local_b00;
  int local_af8;
  int local_af4;
  int local_af0;
  int local_aec;
  int local_ae8;
  int local_ae4;
  ulong local_ae0;
  int local_ad8;
  int local_ad4;
  Mat *local_ad0;
  void **local_ac8;
  long *local_ac0;
  int local_aac;
  void **local_aa8;
  void **local_aa0;
  int local_a94;
  undefined8 *local_a90;
  int local_a84;
  void **local_a80;
  int local_a74;
  undefined8 *local_a70;
  int local_a64;
  void **local_a60;
  int local_a54;
  undefined1 *local_a50;
  int local_a44;
  void **local_a40;
  undefined1 local_a35;
  int local_a34;
  void **local_a30;
  undefined8 *local_a28;
  undefined1 local_a1d;
  int local_a1c;
  void **local_a18;
  undefined8 *local_a10;
  undefined1 local_a05;
  int local_a04;
  void **local_a00;
  undefined8 *local_9f8;
  undefined1 local_9ed;
  int local_9ec;
  void **local_9e8;
  undefined1 *local_9e0;
  undefined1 *local_9b8;
  undefined8 *local_9a8;
  undefined8 *local_998;
  void **local_988;
  void **local_978;
  undefined8 *local_968;
  undefined8 *local_958;
  undefined8 *local_948;
  void **local_938;
  int local_928;
  undefined4 local_924;
  void **local_918;
  void **local_910;
  undefined8 *local_908;
  void **local_8f8;
  int local_8e0;
  undefined4 local_8dc;
  void **local_8d8;
  undefined8 *local_8b8;
  undefined8 *local_898;
  undefined8 *local_878;
  int local_860;
  undefined4 local_85c;
  void **local_858;
  int local_840;
  undefined4 local_83c;
  void **local_838;
  undefined8 *local_818;
  undefined8 *local_7f8;
  undefined1 *local_7d8;
  void **local_790;
  long *local_788;
  long *local_780;
  long *local_778;
  void **local_770;
  long *local_768;
  void **local_760;
  int local_754;
  undefined8 *local_750;
  int local_748;
  undefined4 local_744;
  undefined8 local_740;
  undefined8 uStack_738;
  undefined8 uStack_730;
  undefined8 uStack_728;
  undefined1 *local_720;
  int local_714;
  undefined8 *local_710;
  int local_708;
  undefined4 local_704;
  undefined8 local_700;
  undefined8 uStack_6f8;
  undefined8 uStack_6f0;
  undefined8 uStack_6e8;
  undefined1 *local_6c8;
  undefined8 local_6c0;
  undefined8 uStack_6b8;
  undefined8 uStack_6b0;
  undefined8 uStack_6a8;
  undefined8 *local_690;
  undefined1 (*local_688) [32];
  undefined8 *local_680;
  undefined8 *local_678;
  long *local_670;
  long *local_668;
  undefined8 local_660;
  undefined8 uStack_658;
  undefined8 uStack_650;
  undefined8 uStack_648;
  undefined1 local_640 [8];
  float fStack_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float fStack_628;
  float fStack_624;
  undefined8 local_620;
  undefined8 uStack_618;
  undefined8 uStack_610;
  undefined8 uStack_608;
  undefined1 (*local_5f0) [32];
  int local_5e4;
  undefined8 *local_5e0;
  int local_5d4;
  undefined8 local_5d0;
  undefined8 uStack_5c8;
  undefined8 *local_5c0;
  int local_5b4;
  undefined8 *local_5b0;
  int local_5a4;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 *local_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 *local_568;
  undefined1 (*local_560) [16];
  undefined8 *local_558;
  undefined8 local_550;
  undefined8 uStack_548;
  undefined1 local_540 [8];
  float fStack_538;
  float fStack_534;
  undefined8 local_530;
  undefined8 uStack_528;
  undefined1 (*local_518) [16];
  long local_510;
  long *local_508;
  long local_500;
  long *local_4f8;
  int local_4ec;
  undefined4 *local_4e8;
  int local_4e0;
  undefined4 local_4dc;
  undefined8 *local_4d8;
  undefined1 local_4cd;
  int local_4cc;
  long *local_4c8;
  undefined8 *local_4c0;
  undefined1 local_49d;
  int local_49c;
  long *local_498;
  undefined8 *local_490;
  int local_46c;
  undefined8 *local_468;
  float local_45c;
  float local_458;
  float local_454;
  float local_450;
  float local_44c;
  float local_448;
  float local_444;
  float local_440;
  float local_43c;
  long *local_438;
  undefined4 local_430;
  float local_42c [3];
  long *local_420;
  undefined8 local_418;
  long *local_410;
  undefined8 local_408;
  long *local_400;
  undefined8 local_3f8;
  long *local_3f0;
  undefined8 local_3e8;
  long *local_3e0;
  long local_3d8;
  undefined4 local_3cc;
  long local_3c8;
  long local_3c0;
  undefined4 local_3b4;
  int local_3b0;
  int local_3ac;
  undefined8 *local_3a8;
  long local_3a0;
  undefined4 local_394;
  long local_390;
  long local_388;
  undefined4 local_37c;
  undefined4 local_378;
  int local_374;
  undefined8 *local_370;
  undefined4 local_35c;
  void *local_358;
  undefined8 *local_350;
  int local_344;
  undefined1 *local_338;
  undefined4 local_324;
  void *local_320;
  undefined8 *local_318;
  int local_30c;
  undefined8 *local_300;
  undefined4 local_2ec;
  void *local_2e8;
  undefined4 *local_2e0;
  int local_2d4;
  undefined8 *local_2c8;
  undefined4 local_2b4;
  void *local_2b0;
  void *local_2a8;
  int local_29c;
  undefined8 *local_290;
  undefined4 local_284;
  long local_280;
  undefined4 local_274;
  long local_270;
  undefined4 local_264;
  long local_260;
  undefined4 local_254;
  long local_250;
  undefined4 local_244;
  long local_240;
  undefined4 local_234;
  long local_230;
  void *local_1c8;
  void *local_1b8;
  void *local_178;
  undefined8 *local_160;
  undefined8 *local_158;
  undefined8 *local_150;
  undefined1 *local_148;
  undefined1 *local_140;
  void **local_138;
  long *local_130;
  long *local_128;
  long *local_120;
  void **local_118;
  int local_110;
  undefined4 local_10c;
  void **local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  undefined8 uStack_f0;
  undefined8 uStack_e8;
  undefined8 *local_c8;
  undefined8 local_c0;
  undefined8 uStack_b8;
  undefined8 uStack_b0;
  undefined8 uStack_a8;
  undefined8 *local_98;
  undefined8 local_90;
  undefined8 uStack_88;
  undefined8 *local_78;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 *local_58;
  
  iVar6 = (int)((ulong)in_stack_ffffffffffffed08 >> 0x20);
  opt_00 = (Option *)CONCAT44(in_stack_fffffffffffff38c,in_stack_fffffffffffff388);
  local_ad4 = *(int *)((long)in_RSI + 0x2c);
  local_ad8 = (int)in_RSI[6];
  local_ae0 = in_RSI[2];
  local_ae4 = (int)in_RSI[3];
  local_ae8 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) + -1) + 1;
  local_aec = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) *
              (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) + -1) + 1;
  local_af0 = (local_ad4 + -1) * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) +
              local_ae8 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xfc);
  local_af4 = (local_ad8 + -1) * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) +
              local_aec + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x100);
  local_af8 = 1;
  if (((ulong)in_RCX->allocator & 0x100000000000000) != 0) {
    if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 8 == 0) {
      local_f5c = 8;
    }
    else {
      local_f5c = 1;
      if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0) {
        local_f5c = 4;
      }
    }
    local_af8 = local_f5c;
  }
  local_b00 = (local_ae0 / (ulong)(long)local_ae4) * (long)local_af8;
  local_b04 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) / local_af8;
  local_aa8 = &local_b50;
  local_b50 = (void *)0x0;
  local_b48 = (int *)0x0;
  local_b40 = (void *)0x0;
  local_b38 = 0;
  local_b30 = (long *)0x0;
  local_b28 = 0;
  local_b24 = 0;
  local_b20 = 0;
  local_b1c = 0;
  local_b18 = 0;
  local_b10 = (void *)0x0;
  iVar7 = (int)((ulong)in_stack_ffffffffffffed10 >> 0x20);
  local_ad0 = in_RCX;
  local_ac8 = in_RDX;
  local_ac0 = in_RSI;
  if ((((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xec) < 1) &&
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf0) < 1)) &&
      (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf4) < 1)) &&
     ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xf8) < 1 &&
      ((*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x104) < 1 ||
       (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x108) < 1)))))) {
    local_918 = &local_b50;
    if (local_918 != in_RDX) {
      if (in_RDX[1] != (void *)0x0) {
        piVar1 = (int *)in_RDX[1];
        local_924 = 1;
        LOCK();
        local_928 = *piVar1;
        *piVar1 = *piVar1 + 1;
        UNLOCK();
      }
      local_b50 = *in_RDX;
      local_b48 = (int *)in_RDX[1];
      local_b40 = in_RDX[2];
      local_b38 = *(undefined4 *)(in_RDX + 3);
      local_b30 = (long *)in_RDX[4];
      local_b28 = *(int *)(in_RDX + 5);
      local_b24 = *(int *)((long)in_RDX + 0x2c);
      local_b20 = *(int *)(in_RDX + 6);
      local_b1c = *(int *)((long)in_RDX + 0x34);
      local_b18 = *(int *)(in_RDX + 7);
      local_b10 = in_RDX[8];
      local_8f8 = local_918;
    }
    local_910 = local_918;
    Mat::create(in_stack_ffffffffffffed18,iVar7,(int)in_stack_ffffffffffffed10,iVar6,
                CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                in_stack_ffffffffffffecfc,in_stack_ffffffffffffed78);
  }
  else {
    Mat::create(in_stack_ffffffffffffed18,iVar7,(int)in_stack_ffffffffffffed10,iVar6,
                CONCAT44(in_stack_ffffffffffffed04,in_stack_ffffffffffffed00),
                in_stack_ffffffffffffecfc,in_stack_ffffffffffffed78);
  }
  local_770 = &local_b50;
  if (local_b50 != (void *)0x0) {
    local_138 = local_770;
  }
  local_f79 = local_b50 != (void *)0x0 && (long)local_b10 * (long)local_b18 != 0;
  if (local_f79) {
    local_b64 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4) *
                *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
    if ((local_ad0->field_0x1d & 1) == 0) {
      iVar6 = (int)in_RDI;
      if ((local_ae4 == 8) && (local_af8 == 8)) {
        lVar2 = *(long *)(*in_RDI + -0x18);
        deconvolution_pack8_avx
                  (in_stack_fffffffffffff3a8,in_stack_fffffffffffff3a0,in_stack_fffffffffffff398,
                   (Mat *)CONCAT44(in_stack_fffffffffffff394,in_stack_fffffffffffff390),
                   (int)((ulong)opt_00 >> 0x20),(int)opt_00,*(int *)((long)in_RDI + lVar2 + 0xe0),
                   *(int *)((long)in_RDI + lVar2 + 0xe4),*(int *)((long)in_RDI + lVar2 + 0xe8),
                   *(int *)((long)in_RDI + lVar2 + 0x114),iVar6 + 0x118 + (int)lVar2,local_ad0,
                   (Option *)in_stack_ffffffffffffed18);
      }
      if ((local_ae4 == 4) && (local_af8 == 8)) {
        lVar2 = *(long *)(*in_RDI + -0x18);
        deconvolution_pack4to8_avx
                  ((Mat *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
                   in_stack_fffffffffffff120,in_stack_fffffffffffff118,in_stack_fffffffffffff110,
                   in_stack_fffffffffffff10c,in_stack_fffffffffffff108,
                   *(int *)((long)in_RDI + lVar2 + 0xe0),*(int *)((long)in_RDI + lVar2 + 0xe4),
                   *(int *)((long)in_RDI + lVar2 + 0xe8),*(int *)((long)in_RDI + lVar2 + 0x114),
                   iVar6 + 0x118 + (int)lVar2,local_ad0,(Option *)in_stack_ffffffffffffed18);
      }
      if ((local_ae4 == 8) && (local_af8 == 4)) {
        deconvolution_pack8to4_avx
                  ((Mat *)CONCAT44(in_stack_fffffffffffff12c,in_stack_fffffffffffff128),
                   in_stack_fffffffffffff120,in_stack_fffffffffffff118,in_stack_fffffffffffff110,
                   in_stack_fffffffffffff10c,in_stack_fffffffffffff108,in_stack_00001598,
                   in_stack_000015a0,in_stack_000015a8,in_stack_000015b0,in_stack_000015b8,
                   in_stack_000015c0,in_stack_000015c8);
      }
      if ((local_ae4 == 1) && (local_af8 == 8)) {
        lVar2 = *(long *)(*in_RDI + -0x18);
        deconvolution_pack1to8_avx
                  (in_stack_fffffffffffff048,in_stack_fffffffffffff040,in_stack_fffffffffffff038,
                   (Mat *)CONCAT17(in_stack_fffffffffffff037,in_stack_fffffffffffff030),
                   (int)((ulong)in_stack_fffffffffffff028 >> 0x20),(int)in_stack_fffffffffffff028,
                   *(int *)((long)in_RDI + lVar2 + 0xe0),*(int *)((long)in_RDI + lVar2 + 0xe4),
                   *(int *)((long)in_RDI + lVar2 + 0xe8),*(int *)((long)in_RDI + lVar2 + 0x114),
                   iVar6 + 0x118 + (int)lVar2,local_ad0,(Option *)in_stack_ffffffffffffed18);
      }
      if ((local_ae4 == 8) && (local_af8 == 1)) {
        lVar2 = *(long *)(*in_RDI + -0x18);
        deconvolution_pack8to1_avx
                  (in_stack_ffffffffffffefa8,in_stack_ffffffffffffefa0,in_stack_ffffffffffffef98,
                   in_stack_ffffffffffffef90,(int)((ulong)in_stack_ffffffffffffef88 >> 0x20),
                   (int)in_stack_ffffffffffffef88,*(int *)((long)in_RDI + lVar2 + 0xe0),
                   *(int *)((long)in_RDI + lVar2 + 0xe4),*(int *)((long)in_RDI + lVar2 + 0xe8),
                   *(int *)((long)in_RDI + lVar2 + 0x114),iVar6 + 0x118 + (int)lVar2,local_ad0,
                   (Option *)in_stack_ffffffffffffed18);
      }
      if ((local_ae4 == 4) && (local_af8 == 4)) {
        deconvolution_pack4_sse
                  (in_stack_fffffffffffff028,
                   (Mat *)CONCAT17(in_stack_fffffffffffff027,in_stack_fffffffffffff020),
                   in_stack_fffffffffffff018,in_stack_fffffffffffff010,
                   (int)((ulong)in_stack_fffffffffffff008 >> 0x20),(int)in_stack_fffffffffffff008,
                   in_stack_00001278,in_stack_00001280,in_stack_00001288,in_stack_00001290,
                   in_stack_00001298,in_stack_000012a0,in_stack_000012a8);
      }
      if ((local_ae4 == 1) && (local_af8 == 4)) {
        deconvolution_pack1to4_sse
                  ((Mat *)CONCAT44(in_stack_ffffffffffffef5c,in_stack_ffffffffffffef58),
                   (Mat *)CONCAT44(in_stack_ffffffffffffef54,in_stack_ffffffffffffef50),
                   (Mat *)CONCAT44(in_stack_ffffffffffffef4c,in_stack_ffffffffffffef48),
                   (Mat *)CONCAT44(in_stack_ffffffffffffef44,in_stack_ffffffffffffef40),
                   (int)((ulong)in_stack_ffffffffffffef38 >> 0x20),(int)in_stack_ffffffffffffef38,
                   in_stack_00001018,in_stack_00001020,in_stack_00001028,in_stack_00001030,
                   in_stack_00001038,in_stack_00001040,in_stack_00001048);
      }
      if ((local_ae4 == 4) && (local_af8 == 1)) {
        deconvolution_pack4to1_sse
                  (in_stack_ffffffffffffef38,in_stack_ffffffffffffef30,in_stack_ffffffffffffef28,
                   in_stack_ffffffffffffef20,(int)((ulong)in_stack_ffffffffffffef18 >> 0x20),
                   (int)in_stack_ffffffffffffef18,in_stack_fffffffffffff358,
                   in_stack_fffffffffffff360,in_stack_fffffffffffff368,in_stack_fffffffffffff370,
                   in_stack_fffffffffffff378,in_stack_fffffffffffff380,opt_00);
      }
      if ((local_ae4 == 1) && (local_af8 == 1)) {
        for (local_e0c = 0; local_e0c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_e0c = local_e0c + 1) {
          local_a28 = &local_e60;
          local_a30 = &local_b50;
          local_e18 = (void *)((long)local_b50 + (long)local_b10 * (long)local_e0c * (long)local_b40
                              );
          local_290 = &local_e60;
          local_280 = (long)local_b24 * (long)local_b20 * (long)local_b40;
          local_908 = &local_e60;
          local_968 = &local_e60;
          local_e40 = local_b30;
          local_284 = 0x10;
          local_29c = local_b1c;
          local_2b0 = local_b40;
          local_2b4 = local_b38;
          local_a34 = local_e0c;
          local_a35 = 1;
          local_e60 = 0;
          local_e50 = 0;
          local_e48 = 0;
          local_e38 = 0;
          local_e34 = 0;
          local_e30 = 0;
          local_e2c = 0;
          local_e28 = 0;
          local_e20 = 0;
          local_e58 = 0;
          local_e64 = *(int *)((long)local_ac0 + 0x2c);
          local_e68 = (int)local_ac0[6];
          local_e6c = (int)local_ac0[7];
          local_e70 = local_b24;
          local_e74 = local_b20;
          local_878 = local_968;
          local_2a8 = local_e18;
          for (local_e78 = 0; local_e78 < local_e74; local_e78 = local_e78 + 1) {
            for (local_e7c = 0; local_e7c < local_e70; local_e7c = local_e7c + 1) {
              local_e80 = 0.0;
              if (*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x10c) != 0) {
                local_508 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a8);
                local_510 = (long)local_e0c;
                local_e80 = *(float *)(*local_508 + local_510 * 4);
              }
              local_498 = in_RDI + 3;
              local_490 = &local_ed0;
              local_3ac = *(int *)((long)in_RDI + 0x44);
              local_3b0 = (int)in_RDI[9];
              local_3b4 = *(undefined4 *)((long)in_RDI + 0x4c);
              local_3c0 = *local_498 + in_RDI[0xb] * (long)local_e0c * in_RDI[5];
              local_3c8 = in_RDI[5];
              local_3cc = (undefined4)in_RDI[6];
              local_3d8 = in_RDI[7];
              local_3a8 = &local_ed0;
              local_230 = (long)local_3ac * (long)local_3b0 * local_3c8;
              local_678 = &local_ed0;
              local_958 = &local_ed0;
              local_234 = 0x10;
              local_49c = local_e0c;
              local_49d = 1;
              local_ed0 = 0;
              local_ec0 = 0;
              local_eb8 = 0;
              local_ea8 = 0;
              local_ea4 = 0;
              local_ea0 = 0;
              local_e9c = 0;
              local_e98 = 0;
              local_e90 = 0;
              local_ec8 = 0;
              iVar6 = 0;
              local_e88 = local_3c0;
              while (iVar7 = iVar6, fVar12 = local_e80, iVar7 < local_e6c) {
                local_4c0 = &local_f20;
                local_4c8 = local_ac0;
                local_374 = *(int *)((long)local_ac0 + 0x2c);
                local_378 = (undefined4)local_ac0[6];
                local_37c = *(undefined4 *)((long)local_ac0 + 0x34);
                local_388 = *local_ac0 + local_ac0[8] * (long)iVar7 * local_ac0[2];
                local_390 = local_ac0[2];
                local_394 = (undefined4)local_ac0[3];
                local_3a0 = local_ac0[4];
                local_370 = &local_f20;
                uVar16 = 1;
                local_240 = (long)local_374 * (long)(int)in_stack_fffffffffffff110 * local_390;
                local_244 = 0x10;
                local_4cd = 1;
                for (local_f24 = 0;
                    local_f24 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8);
                    local_f24 = local_f24 + 1) {
                  iVar6 = (local_e78 +
                          local_f24 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0)) -
                          (local_aec + -1);
                  if (((-1 < iVar6) &&
                      (iVar6 % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) == 0)) &&
                     (iVar6 = iVar6 / *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8),
                     iVar6 < local_e68)) {
                    local_468 = &local_f20;
                    for (local_f3c = 0; local_46c = iVar6,
                        local_f3c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                        local_f3c = local_f3c + 1) {
                      iVar8 = (local_e7c +
                              local_f3c * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)
                              ) - (local_ae8 + -1);
                      if (((-1 < iVar8) &&
                          (iVar8 % *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) == 0))
                         && (iVar8 = iVar8 / *(int *)((long)in_RDI +
                                                     *(long *)(*in_RDI + -0x18) + 0xe4),
                            iVar8 < local_e64)) {
                        local_e80 = *(float *)(local_388 + (long)local_374 * (long)iVar6 * local_390
                                              + (long)iVar8 * 4) *
                                    *(float *)(local_e88 +
                                              (long)(local_f24 *
                                                     *(int *)((long)in_RDI +
                                                             *(long *)(*in_RDI + -0x18) + 0xd4) +
                                                    local_f3c) * 4) + local_e80;
                      }
                    }
                  }
                }
                local_e88 = local_e88 + (long)local_b64 * 4;
                local_948 = &local_f20;
                local_f20 = 0;
                local_f10 = 0;
                local_f08 = 0;
                uVar16 = 0;
                local_f18 = 0;
                local_8b8 = local_948;
                local_4cc = iVar7;
                local_f00 = local_3a0;
                iVar6 = iVar7 + 1;
              }
              local_430 = *(undefined4 *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x114);
              local_438 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x118);
              local_42c[0] = local_e80;
              local_898 = local_958;
              local_eb0 = local_3d8;
              switch(local_430) {
              case 1:
                auVar3 = vmaxss_avx(ZEXT416((uint)local_e80),ZEXT816(0));
                local_42c[0] = auVar3._0_4_;
                break;
              case 2:
                local_3e8 = 0;
                local_43c = *(float *)*local_438;
                if (local_e80 <= 0.0) {
                  local_12b4 = local_e80 * local_43c;
                }
                else {
                  local_12b4 = local_e80;
                }
                local_42c[0] = local_12b4;
                local_3e0 = local_438;
                break;
              case 3:
                local_3f8 = 0;
                local_440 = *(float *)*local_438;
                local_408 = 1;
                local_444 = *(float *)(*local_438 + 4);
                if (local_e80 < local_440) {
                  local_42c[0] = local_440;
                }
                local_400 = local_438;
                local_3f0 = local_438;
                if (local_444 < local_42c[0]) {
                  local_42c[0] = local_444;
                }
                break;
              case 4:
                local_448 = 88.37626;
                pfVar10 = std::min<float>(local_42c,&local_448);
                local_42c[0] = *pfVar10;
                local_44c = -88.37626;
                pfVar10 = std::max<float>(local_42c,&local_44c);
                local_42c[0] = *pfVar10;
                fVar12 = expf(-local_42c[0]);
                local_42c[0] = 1.0 / (fVar12 + 1.0);
                break;
              case 5:
                fVar13 = expf(local_e80);
                fVar13 = logf(fVar13 + 1.0);
                local_42c[0] = tanhf(fVar13);
                local_42c[0] = fVar12 * local_42c[0];
                break;
              case 6:
                local_418 = 0;
                local_450 = *(float *)*local_438;
                local_42c[1] = 1.4013e-45;
                local_42c[2] = 0.0;
                local_454 = *(float *)(*local_438 + 4);
                local_458 = -local_454 / local_450;
                local_45c = 1.0 / local_450 + local_458;
                local_420 = local_438;
                local_410 = local_438;
                if (local_458 <= local_e80) {
                  if (local_e80 <= local_45c) {
                    local_42c[0] = local_e80 * (local_e80 * local_450 + local_454);
                  }
                }
                else {
                  local_42c[0] = 0.0;
                }
              }
              local_e80 = local_42c[0];
              *(float *)((long)local_e18 + (long)local_e7c * 4) = local_42c[0];
            }
            local_e18 = (void *)((long)local_e18 + (long)local_e70 * 4);
          }
        }
      }
    }
    else {
      local_760 = &local_bb0;
      local_768 = local_ac0;
      local_bb0 = (void *)*local_ac0;
      local_ba8 = (int *)local_ac0[1];
      local_ba0 = local_ac0[2];
      local_b98 = (undefined4)local_ac0[3];
      local_b90 = (long *)local_ac0[4];
      local_b88 = (undefined4)local_ac0[5];
      local_b7c = *(undefined4 *)((long)local_ac0 + 0x34);
      local_b78 = (undefined4)local_ac0[7];
      local_b70 = local_ac0[8];
      if (local_ba8 != (int *)0x0) {
        local_10c = 1;
        LOCK();
        local_110 = *local_ba8;
        *local_ba8 = *local_ba8 + 1;
        UNLOCK();
      }
      local_b84 = *(int *)((long)local_ac0 + 0x2c) * (int)local_ac0[6];
      local_b80 = 1;
      local_aa0 = &local_bf8;
      local_bf8 = (void *)0x0;
      local_bf0 = (int *)0x0;
      local_be8 = 0;
      local_be0 = 0;
      local_bd8 = (long *)0x0;
      local_bd0 = 0;
      local_bcc = 0;
      local_bc8 = 0;
      local_bc4 = 0;
      local_bc0 = 0;
      local_bb8 = 0;
      local_c40 = local_ad0->data;
      sStack_c30 = local_ad0->elemsize;
      uStack_c28 = *(undefined8 *)&local_ad0->elempack;
      local_c20 = local_ad0->allocator;
      uStack_c18._0_4_ = local_ad0->dims;
      uStack_c18._4_4_ = local_ad0->w;
      uStack_c10._0_4_ = local_ad0->h;
      uStack_c10._4_4_ = local_ad0->d;
      uStack_c08 = *(undefined8 *)&local_ad0->c;
      plStack_c38 = local_b30;
      local_108 = local_760;
      (**(code **)(*(long *)in_RDI[2] + 0x38))((long *)in_RDI[2],&local_bb0,&local_bf8,&local_c40);
      iVar6 = (local_af0 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe8) -
              local_ad4 * *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4)) * local_af8;
      if (local_af8 == 8) {
        for (local_c48 = 0; local_c48 < local_b04; local_c48 = local_c48 + 1) {
          local_a44 = local_c48 * local_b64;
          local_a40 = &local_bf8;
          local_c50 = (undefined8 *)
                      ((long)local_bf8 + (long)local_bcc * (long)local_a44 * local_be8);
          local_9e0 = &stack0xfffffffffffff368;
          local_9e8 = &local_b50;
          local_350 = (undefined8 *)
                      ((long)local_b50 + (long)local_b10 * (long)local_c48 * (long)local_b40);
          local_338 = &stack0xfffffffffffff368;
          uVar16 = 1;
          local_250 = (long)local_b24 * (long)(int)in_stack_fffffffffffff398 * (long)local_b40;
          iVar7 = (int)((local_250 + 0xfU & 0xfffffffffffffff0) / (ulong)local_b40);
          if (local_b28 == 4) {
            iVar7 = local_b24 * local_b20;
          }
          lVar2 = *(long *)(*in_RDI + -0x18);
          local_778 = (long *)((long)in_RDI + lVar2 + 0x1a8);
          bVar11 = true;
          if (*local_778 != 0) {
            bVar11 = *(long *)((long)in_RDI + lVar2 + 0x1e8) *
                     (long)*(int *)((long)in_RDI + lVar2 + 0x1e0) == 0;
            local_130 = local_778;
          }
          if (bVar11) {
            local_6c0 = 0;
            uStack_6b8 = 0;
            uStack_6b0 = 0;
            uStack_6a8 = 0;
            local_6c8 = &stack0xfffffffffffff368;
            local_700 = 0;
            uStack_6f8 = 0;
            uStack_6f0 = 0;
            uStack_6e8 = 0;
            local_704 = 0;
            local_708 = iVar7 * (int)in_stack_fffffffffffff3a0;
            local_710 = local_350;
            for (local_714 = 0; local_148 = local_6c8, local_714 < local_708;
                local_714 = local_714 + 1) {
              local_c8 = local_710;
              local_100 = 0;
              uStack_f8 = 0;
              uStack_f0 = 0;
              uStack_e8 = 0;
              *local_710 = 0;
              local_710[1] = 0;
              local_710[2] = 0;
              local_710[3] = 0;
              local_710 = local_710 + 4;
            }
          }
          else {
            local_668 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a8);
            local_680 = (undefined8 *)(*local_668 + (long)(local_c48 << 3) * 4);
            local_740 = *local_680;
            uStack_738 = local_680[1];
            uStack_730 = local_680[2];
            uStack_728 = local_680[3];
            local_720 = &stack0xfffffffffffff368;
            local_744 = 0;
            local_748 = iVar7 * (int)in_stack_fffffffffffff3a0;
            local_750 = local_350;
            for (local_754 = 0; local_140 = local_720, local_754 < local_748;
                local_754 = local_754 + 1) {
              local_98 = local_750;
              *local_750 = local_740;
              local_750[1] = uStack_738;
              local_750[2] = uStack_730;
              local_750[3] = uStack_728;
              local_750 = local_750 + 4;
              local_c0 = local_740;
              uStack_b8 = uStack_738;
              uStack_b0 = uStack_730;
              uStack_a8 = uStack_728;
            }
          }
          for (local_c9c = 0; local_c9c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)
              ; local_c9c = local_c9c + 1) {
            for (iVar7 = 0; iVar7 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                iVar7 = iVar7 + 1) {
              local_a54 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) * local_c9c;
              local_a50 = &stack0xfffffffffffff368;
              pauVar9 = (undefined1 (*) [32])
                        ((long)local_350 +
                        (long)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) * iVar7 *
                              8) * 4 + (long)local_b24 * (long)local_a54 * (long)local_b40);
              for (local_cac = 0; local_cac < local_ad8; local_cac = local_cac + 1) {
                for (local_cb0 = 0; pauVar15 = pauVar9, local_cb0 < local_ad4;
                    local_cb0 = local_cb0 + 1) {
                  auVar4 = *(undefined1 (*) [24])*pauVar15;
                  auVar5 = *pauVar15;
                  local_690 = local_c50;
                  local_d00 = *local_c50;
                  uStack_cf8 = local_c50[1];
                  uStack_cf0 = local_c50[2];
                  uStack_ce8 = local_c50[3];
                  local_640._0_4_ = auVar4._0_4_;
                  local_640._4_4_ = auVar4._4_4_;
                  fStack_638 = auVar4._8_4_;
                  fStack_634 = auVar4._12_4_;
                  fStack_630 = auVar4._16_4_;
                  fStack_62c = auVar4._20_4_;
                  fStack_628 = (float)*(undefined8 *)(*pauVar15 + 0x18);
                  fStack_624 = (float)((ulong)*(undefined8 *)(*pauVar15 + 0x18) >> 0x20);
                  local_660._0_4_ = (float)local_d00;
                  local_660._4_4_ = (float)((ulong)local_d00 >> 0x20);
                  uStack_658._0_4_ = (float)uStack_cf8;
                  uStack_658._4_4_ = (float)((ulong)uStack_cf8 >> 0x20);
                  uStack_650._0_4_ = (float)uStack_cf0;
                  uStack_650._4_4_ = (float)((ulong)uStack_cf0 >> 0x20);
                  uStack_648._0_4_ = (float)uStack_ce8;
                  uStack_648._4_4_ = (float)((ulong)uStack_ce8 >> 0x20);
                  local_ce0 = CONCAT44((float)local_640._4_4_ + local_660._4_4_,
                                       (float)local_640._0_4_ + (float)local_660);
                  uStack_cd8 = CONCAT44(fStack_634 + uStack_658._4_4_,fStack_638 + (float)uStack_658
                                       );
                  uStack_cd0 = CONCAT44(fStack_62c + uStack_650._4_4_,fStack_630 + (float)uStack_650
                                       );
                  uStack_cc8 = CONCAT44(fStack_624 + uStack_648._4_4_,fStack_628 + (float)uStack_648
                                       );
                  *(undefined8 *)*pauVar15 = local_ce0;
                  *(undefined8 *)(*pauVar15 + 8) = uStack_cd8;
                  *(undefined8 *)(*pauVar15 + 0x10) = uStack_cd0;
                  *(undefined8 *)(*pauVar15 + 0x18) = uStack_cc8;
                  local_c50 = local_c50 + 4;
                  pauVar9 = (undefined1 (*) [32])
                            (*pauVar15 +
                            (long)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) << 3)
                            * 4);
                  local_688 = pauVar15;
                  local_660 = local_d00;
                  uStack_658 = uStack_cf8;
                  uStack_650 = uStack_cf0;
                  uStack_648 = uStack_ce8;
                  _local_640 = auVar5;
                  local_620 = local_ce0;
                  uStack_618 = uStack_cd8;
                  uStack_610 = uStack_cd0;
                  uStack_608 = uStack_cc8;
                  local_5f0 = pauVar15;
                }
                pauVar9 = (undefined1 (*) [32])(*pauVar15 + (long)iVar6 * 4);
              }
            }
          }
          local_9b8 = &stack0xfffffffffffff368;
          local_254 = 0x10;
          local_344 = local_b1c;
          local_358 = local_b40;
          local_35c = local_b38;
          local_9ec = local_c48;
          local_9ed = 1;
          uVar16 = 0;
          uVar16 = 0;
          local_7d8 = local_9b8;
        }
      }
      if (local_af8 == 4) {
        for (local_d04 = 0; local_d04 < local_b04; local_d04 = local_d04 + 1) {
          local_a64 = local_d04 * local_b64;
          local_a60 = &local_bf8;
          local_d10 = (undefined8 *)
                      ((long)local_bf8 + (long)local_bcc * (long)local_a64 * local_be8);
          local_9f8 = &local_d58;
          local_a00 = &local_b50;
          local_a04 = local_d04;
          local_30c = local_b1c;
          local_318 = (undefined8 *)
                      ((long)local_b50 + (long)local_b10 * (long)local_d04 * (long)local_b40);
          local_320 = local_b40;
          local_324 = local_b38;
          local_300 = &local_d58;
          local_d38 = local_b30;
          local_260 = (long)local_b24 * (long)local_b20 * (long)local_b40;
          local_264 = 0x10;
          local_d18._0_4_ = (int)((local_260 + 0xfU & 0xfffffffffffffff0) / (ulong)local_b40);
          if (local_b28 == 4) {
            local_d18._0_4_ = local_b24 * local_b20;
          }
          local_a05 = 1;
          lVar2 = *(long *)(*in_RDI + -0x18);
          local_780 = (long *)((long)in_RDI + lVar2 + 0x1a8);
          bVar11 = true;
          if (*local_780 != 0) {
            bVar11 = *(long *)((long)in_RDI + lVar2 + 0x1e8) *
                     (long)*(int *)((long)in_RDI + lVar2 + 0x1e0) == 0;
            local_128 = local_780;
          }
          if (bVar11) {
            local_580 = 0;
            uStack_578 = 0;
            local_588 = &local_d58;
            local_5a0 = 0;
            uStack_598 = 0;
            local_5a4 = (int)local_d18 * local_b1c;
            local_5b0 = local_318;
            for (local_5b4 = 0; local_158 = local_588, local_5b4 < local_5a4;
                local_5b4 = local_5b4 + 1) {
              local_78 = local_5b0;
              local_90 = 0;
              uStack_88 = 0;
              *local_5b0 = 0;
              local_5b0[1] = 0;
              local_5b0 = local_5b0 + 2;
            }
          }
          else {
            local_670 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a8);
            local_558 = (undefined8 *)(*local_670 + (long)(local_d04 << 2) * 4);
            local_5d0 = *local_558;
            uStack_5c8 = local_558[1];
            local_5c0 = &local_d58;
            local_5d4 = (int)local_d18 * local_b1c;
            local_5e0 = local_318;
            for (local_5e4 = 0; local_150 = local_5c0, local_5e4 < local_5d4;
                local_5e4 = local_5e4 + 1) {
              local_58 = local_5e0;
              *local_5e0 = local_5d0;
              local_5e0[1] = uStack_5c8;
              local_5e0 = local_5e0 + 2;
              local_70 = local_5d0;
              uStack_68 = uStack_5c8;
            }
          }
          for (local_d5c = 0; local_d5c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)
              ; local_d5c = local_d5c + 1) {
            for (local_d60 = 0;
                local_d60 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                local_d60 = local_d60 + 1) {
              local_a74 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) * local_d5c;
              local_a70 = &local_d58;
              local_d68 = (undefined1 (*) [16])
                          ((long)local_318 +
                          (long)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc) *
                                 local_d60 * 4) * 4 +
                          (long)local_b24 * (long)local_a74 * (long)local_b40);
              for (local_d6c = 0; local_d6c < local_ad8; local_d6c = local_d6c + 1) {
                for (local_d70 = 0; local_d70 < local_ad4; local_d70 = local_d70 + 1) {
                  local_560 = local_d68;
                  auVar3 = *local_d68;
                  local_568 = local_d10;
                  local_d90 = *local_d10;
                  uStack_d88 = local_d10[1];
                  local_540._0_4_ = (undefined4)*(undefined8 *)*local_d68;
                  local_540._4_4_ = (undefined4)((ulong)*(undefined8 *)*local_d68 >> 0x20);
                  fStack_538 = (float)*(undefined8 *)(*local_d68 + 8);
                  fStack_534 = (float)((ulong)*(undefined8 *)(*local_d68 + 8) >> 0x20);
                  local_550._0_4_ = (float)local_d90;
                  local_550._4_4_ = (float)((ulong)local_d90 >> 0x20);
                  uStack_548._0_4_ = (float)uStack_d88;
                  uStack_548._4_4_ = (float)((ulong)uStack_d88 >> 0x20);
                  local_d80 = CONCAT44((float)local_540._4_4_ + local_550._4_4_,
                                       (float)local_540._0_4_ + (float)local_550);
                  uStack_d78 = CONCAT44(fStack_534 + uStack_548._4_4_,fStack_538 + (float)uStack_548
                                       );
                  local_518 = local_d68;
                  *(undefined8 *)*local_d68 = local_d80;
                  *(undefined8 *)(*local_d68 + 8) = uStack_d78;
                  local_d68 = (undefined1 (*) [16])
                              (*local_d68 +
                              (long)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4) << 2
                                    ) * 4);
                  local_d10 = local_d10 + 2;
                  local_550 = local_d90;
                  uStack_548 = uStack_d88;
                  _local_540 = auVar3;
                  local_530 = local_d80;
                  uStack_528 = uStack_d78;
                }
                local_d68 = (undefined1 (*) [16])(*local_d68 + (long)iVar6 * 4);
              }
            }
          }
          local_9a8 = &local_d58;
          local_d58 = 0;
          local_d48 = 0;
          local_d40 = 0;
          local_d30 = 0;
          local_d2c = 0;
          local_d28 = 0;
          local_d24 = 0;
          local_d20 = 0;
          local_d18 = 0;
          local_d50 = 0;
          local_7f8 = local_9a8;
        }
      }
      if (local_af8 == 1) {
        for (local_d94 = 0; local_d94 < local_b04; local_d94 = local_d94 + 1) {
          local_a84 = local_d94 * local_b64;
          local_a80 = &local_bf8;
          local_da0 = (float *)((long)local_bf8 + (long)local_bcc * (long)local_a84 * local_be8);
          local_a10 = &local_de8;
          local_a18 = &local_b50;
          local_2e0 = (undefined4 *)
                      ((long)local_b50 + (long)local_b10 * (long)local_d94 * (long)local_b40);
          local_2c8 = &local_de8;
          local_dc8 = local_b30;
          local_270 = (long)local_b24 * (long)local_b20 * (long)local_b40;
          local_da8._0_4_ = (int)((local_270 + 0xfU & 0xfffffffffffffff0) / (ulong)local_b40);
          if (local_b28 == 4) {
            local_da8._0_4_ = local_b24 * local_b20;
          }
          local_274 = 0x10;
          local_2d4 = local_b1c;
          local_2e8 = local_b40;
          local_2ec = local_b38;
          local_a1c = local_d94;
          local_a1d = 1;
          lVar2 = *(long *)(*in_RDI + -0x18);
          local_788 = (long *)((long)in_RDI + lVar2 + 0x1a8);
          bVar11 = true;
          if (*local_788 != 0) {
            bVar11 = *(long *)((long)in_RDI + lVar2 + 0x1e8) *
                     (long)*(int *)((long)in_RDI + lVar2 + 0x1e0) == 0;
            local_120 = local_788;
          }
          if (bVar11) {
            local_11b0 = 0;
          }
          else {
            local_4f8 = (long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x1a8);
            local_500 = (long)local_d94;
            local_11b0 = *(undefined4 *)(*local_4f8 + local_500 * 4);
          }
          local_dec = local_11b0;
          local_4d8 = &local_de8;
          local_4dc = local_11b0;
          local_4e0 = (int)local_da8 * local_b1c;
          local_4e8 = local_2e0;
          for (local_4ec = 0; local_4ec < local_4e0; local_4ec = local_4ec + 1) {
            *local_4e8 = local_11b0;
            local_4e8 = local_4e8 + 1;
          }
          for (local_df0 = 0; local_df0 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8)
              ; local_df0 = local_df0 + 1) {
            for (local_df4 = 0;
                local_df4 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
                local_df4 = local_df4 + 1) {
              local_a94 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe0) * local_df0;
              local_a90 = &local_de8;
              local_e00 = (float *)((long)local_2e0 +
                                   (long)(*(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc)
                                         * local_df4) * 4 +
                                   (long)local_b24 * (long)local_a94 * (long)local_b40);
              for (local_e04 = 0; local_e04 < local_ad8; local_e04 = local_e04 + 1) {
                for (local_e08 = 0; local_e08 < local_ad4; local_e08 = local_e08 + 1) {
                  *local_e00 = *local_da0 + *local_e00;
                  local_e00 = local_e00 + *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4)
                  ;
                  local_da0 = local_da0 + 1;
                }
                local_e00 = local_e00 + iVar6;
              }
            }
          }
          local_998 = &local_de8;
          local_de8 = 0;
          local_dd8 = 0;
          local_dd0 = 0;
          local_dc0 = 0;
          local_dbc = 0;
          local_db8 = 0;
          local_db4 = 0;
          local_db0 = 0;
          local_da8 = 0;
          local_de0 = 0;
          local_818 = local_998;
          local_160 = local_4d8;
        }
      }
      if (in_RDI[1] != 0) {
        (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],&local_b50,local_ad0);
      }
      local_988 = &local_bf8;
      local_838 = local_988;
      if (local_bf0 != (int *)0x0) {
        local_83c = 0xffffffff;
        LOCK();
        local_840 = *local_bf0;
        *local_bf0 = *local_bf0 + -1;
        UNLOCK();
        if (local_840 == 1) {
          if (local_bd8 == (long *)0x0) {
            local_1c8 = local_bf8;
            if (local_bf8 != (void *)0x0) {
              free(local_bf8);
            }
          }
          else {
            (**(code **)(*local_bd8 + 0x18))(local_bd8,local_bf8);
          }
        }
      }
      local_bf8 = (void *)0x0;
      local_be8 = 0;
      local_be0 = 0;
      local_bd0 = 0;
      local_bcc = 0;
      local_bc8 = 0;
      local_bc4 = 0;
      local_bc0 = 0;
      local_bb8 = 0;
      local_bf0 = (int *)0x0;
      local_978 = &local_bb0;
      local_858 = local_978;
      if (local_ba8 != (int *)0x0) {
        local_85c = 0xffffffff;
        LOCK();
        local_860 = *local_ba8;
        *local_ba8 = *local_ba8 + -1;
        UNLOCK();
        if (local_860 == 1) {
          if (local_b90 == (long *)0x0) {
            local_1b8 = local_bb0;
            if (local_bb0 != (void *)0x0) {
              free(local_bb0);
            }
          }
          else {
            (**(code **)(*local_b90 + 0x18))(local_b90,local_bb0);
          }
        }
      }
      local_bb0 = (void *)0x0;
      local_ba0 = 0;
      local_b98 = 0;
      local_b88 = 0;
      local_b84 = 0;
      local_b80 = 0;
      local_b7c = 0;
      local_b78 = 0;
      local_b70 = 0;
      local_ba8 = (int *)0x0;
    }
    Deconvolution::cut_padding
              ((Deconvolution *)CONCAT17(in_stack_ffffffffffffed37,in_stack_ffffffffffffed30),
               in_stack_ffffffffffffed28,in_stack_ffffffffffffed20,
               (Option *)in_stack_ffffffffffffed18);
    local_790 = local_ac8;
    bVar11 = true;
    if (*local_ac8 != (void *)0x0) {
      local_118 = local_ac8;
      bVar11 = (long)local_ac8[8] * (long)*(int *)(local_ac8 + 7) == 0;
    }
    if (bVar11) {
      local_aac = -100;
    }
    else {
      local_aac = 0;
    }
  }
  else {
    local_aac = -100;
  }
  local_b60 = 1;
  ppvVar14 = &local_b50;
  if (local_b48 != (int *)0x0) {
    local_8dc = 0xffffffff;
    LOCK();
    local_8e0 = *local_b48;
    *local_b48 = *local_b48 + -1;
    UNLOCK();
    if (local_8e0 == 1) {
      local_938 = ppvVar14;
      local_8d8 = ppvVar14;
      if (local_b30 == (long *)0x0) {
        local_178 = local_b50;
        if (local_b50 != (void *)0x0) {
          free(local_b50);
        }
      }
      else {
        (**(code **)(*local_b30 + 0x18))(local_b30,local_b50);
      }
    }
  }
  *ppvVar14 = (void *)0x0;
  ppvVar14[2] = (void *)0x0;
  *(undefined4 *)(ppvVar14 + 3) = 0;
  *(undefined4 *)(ppvVar14 + 5) = 0;
  *(undefined4 *)((long)ppvVar14 + 0x2c) = 0;
  *(undefined4 *)(ppvVar14 + 6) = 0;
  *(undefined4 *)((long)ppvVar14 + 0x34) = 0;
  *(undefined4 *)(ppvVar14 + 7) = 0;
  ppvVar14[8] = (void *)0x0;
  ppvVar14[1] = (void *)0x0;
  return local_aac;
}

Assistant:

int Deconvolution_x86_avx::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    // deconvolv with NxN kernel
    // value = value + bias

    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int elempack = bottom_blob.elempack;

    //     NCNN_LOGE("Deconvolution input %d x %d  pad = %d %d  ksize=%d %d  stride=%d %d", w, h, pad_w, pad_h, kernel_w, kernel_h, stride_w, stride_h);

    const int kernel_extent_w = dilation_w * (kernel_w - 1) + 1;
    const int kernel_extent_h = dilation_h * (kernel_h - 1) + 1;

    int outw = (w - 1) * stride_w + kernel_extent_w + output_pad_right;
    int outh = (h - 1) * stride_h + kernel_extent_h + output_pad_bottom;
    int out_elempack = 1;
#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX512F__
        out_elempack = num_output % 16 == 0 ? 16 : num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#elif __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__
    size_t out_elemsize = elemsize / elempack * out_elempack;

    int out_channels = num_output / out_elempack;

    Mat top_blob_bordered;
    if (pad_left > 0 || pad_right > 0 || pad_top > 0 || pad_bottom > 0 || (output_w > 0 && output_h > 0))
    {
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.workspace_allocator);
    }
    else
    {
        top_blob_bordered = top_blob;
        top_blob_bordered.create(outw, outh, out_channels, out_elemsize, out_elempack, opt.blob_allocator);
    }
    if (top_blob_bordered.empty())
        return -100;

    const int maxk = kernel_w * kernel_h;

    if (opt.use_sgemm_convolution)
    {
        // sgemm
        Mat bottom_blob_2 = bottom_blob;
        {
            bottom_blob_2.w = bottom_blob.w * bottom_blob.h;
            bottom_blob_2.h = 1;
        }
        Mat top_col2im;
        Option opt_b = opt;
        opt_b.blob_allocator = top_blob_bordered.allocator;
        gemm->forward(bottom_blob_2, top_col2im, opt_b);

        {
            // col2im
            const int gap = (outw * stride_h - w * stride_w) * out_elempack;

#if __SSE2__
#if __AVX__
#if __AVX512F__
            if (out_elempack == 16)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm512_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm512_load_ps((const float*)bias_data + p * 16));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 16;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m512 _val = _mm512_load_ps(ptr);
                                    __m512 _s = _mm512_load_ps(sptr);
                                    _val = _mm512_add_ps(_val, _s);
                                    _mm512_store_ps(ptr, _val);

                                    ptr += stride_w * 16;
                                    sptr += 16;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX512F__

            if (out_elempack == 8)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm256_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm256_load_ps((const float*)bias_data + p * 8));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 8;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m256 _val = _mm256_load_ps(ptr);
                                    __m256 _s = _mm256_load_ps(sptr);
                                    _val = _mm256_add_ps(_val, _s);
                                    _mm256_store_ps(ptr, _val);

                                    ptr += stride_w * 8;
                                    sptr += 8;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __AVX__

            if (out_elempack == 4)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    if (bias_data.empty())
                    {
                        outm.fill(_mm_setzero_ps());
                    }
                    else
                    {
                        outm.fill(_mm_load_ps((const float*)bias_data + p * 4));
                    }

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v * 4;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    __m128 _val = _mm_load_ps(ptr);
                                    __m128 _s = _mm_load_ps(sptr);
                                    _val = _mm_add_ps(_val, _s);
                                    _mm_store_ps(ptr, _val);

                                    ptr += stride_w * 4;
                                    sptr += 4;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
#endif // __SSE2__

            if (out_elempack == 1)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int p = 0; p < out_channels; p++)
                {
                    const float* sptr = top_col2im.row(p * maxk);
                    Mat outm = top_blob_bordered.channel(p);

                    const float bias = bias_data.empty() ? 0.f : bias_data[p];
                    outm.fill(bias);

                    for (int u = 0; u < kernel_h; u++)
                    {
                        for (int v = 0; v < kernel_w; v++)
                        {
                            float* ptr = outm.row(dilation_h * u) + dilation_w * v;

                            for (int i = 0; i < h; i++)
                            {
                                for (int j = 0; j < w; j++)
                                {
                                    ptr[0] += sptr[0];

                                    ptr += stride_w;
                                    sptr += 1;
                                }

                                ptr += gap;
                            }
                        }
                    }
                }
            }
        }

        if (activation)
        {
            activation->forward_inplace(top_blob_bordered, opt);
        }
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (elempack == 16 && out_elempack == 16)
        {
            deconvolution_pack16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 16)
        {
            deconvolution_pack8to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 8)
        {
            deconvolution_pack16to8_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 16)
        {
            deconvolution_pack4to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 4)
        {
            deconvolution_pack16to4_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 16)
        {
            deconvolution_pack1to16_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 16 && out_elempack == 1)
        {
            deconvolution_pack16to1_avx512(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX512F__

        if (elempack == 8 && out_elempack == 8)
        {
            deconvolution_pack8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 8)
        {
            deconvolution_pack4to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 4)
        {
            deconvolution_pack8to4_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 8)
        {
            deconvolution_pack1to8_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 8 && out_elempack == 1)
        {
            deconvolution_pack8to1_avx(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __AVX__

        if (elempack == 4 && out_elempack == 4)
        {
            deconvolution_pack4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 1 && out_elempack == 4)
        {
            deconvolution_pack1to4_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }

        if (elempack == 4 && out_elempack == 1)
        {
            deconvolution_pack4to1_sse(bottom_blob, top_blob_bordered, weight_data_tm, bias_data, kernel_w, kernel_h, dilation_w, dilation_h, stride_w, stride_h, activation_type, activation_params, opt);
        }
#endif // __SSE2__

        if (elempack == 1 && out_elempack == 1)
        {
            // num_output
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int p = 0; p < num_output; p++)
            {
                float* outptr = top_blob_bordered.channel(p);

                // shadowed variable for less openmp task args
                const int w = bottom_blob.w;
                const int h = bottom_blob.h;
                const int channels = bottom_blob.c;
                const int outw = top_blob_bordered.w;
                const int outh = top_blob_bordered.h;

                for (int i = 0; i < outh; i++)
                {
                    for (int j = 0; j < outw; j++)
                    {
                        float sum = 0.f;

                        if (bias_term)
                        {
                            sum = bias_data[p];
                        }

                        const float* kptr = (const float*)weight_data_tm.channel(p);

                        // channels
                        for (int q = 0; q < channels; q++)
                        {
                            const Mat m = bottom_blob.channel(q);

                            for (int y = 0; y < kernel_h; y++)
                            {
                                int sys = (i + y * dilation_h - (kernel_extent_h - 1));
                                if (sys < 0 || sys % stride_h != 0)
                                    continue;

                                int sy = sys / stride_h;
                                if (sy >= h)
                                    continue;

                                const float* sptr = m.row(sy);

                                for (int x = 0; x < kernel_w; x++)
                                {
                                    int sxs = (j + x * dilation_w - (kernel_extent_w - 1));
                                    if (sxs < 0 || sxs % stride_w != 0)
                                        continue;

                                    int sx = sxs / stride_w;
                                    if (sx >= w)
                                        continue;

                                    float val = sptr[sx];

                                    int k = y * kernel_w + x;

                                    float w = kptr[k];

                                    sum += val * w;
                                }
                            }

                            kptr += maxk;
                        }

                        sum = activation_ss(sum, activation_type, activation_params);

                        outptr[j] = sum;
                    }

                    outptr += outw;
                }
            }
        }
    }

    cut_padding(top_blob_bordered, top_blob, opt);
    if (top_blob.empty())
        return -100;

    return 0;
}